

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pss)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  unsigned_long_long uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar11;
  uint uVar12;
  undefined1 in_XMM1 [16];
  undefined1 auVar10 [16];
  uint uVar13;
  
  uVar4 = pss + 1;
  if (params.fParams.contentSizeFlag == 0) {
    uVar4 = 0;
  }
  zcs->streamStage = zcss_init;
  if (pss != 0) {
    uVar4 = pss + 1;
  }
  zcs->pledgedSrcSizePlusOne = uVar4;
  sVar1 = ZSTD_checkCParams(params.cParams);
  if (sVar1 < 0xffffffffffffff89) {
    uVar5 = params.cParams.windowLog - 0x20;
    uVar6 = params.cParams.chainLog - 0x1f;
    uVar7 = params.cParams.hashLog - 0x1f;
    uVar8 = params.cParams.searchLog - 0x1f;
    auVar10 = pmovsxbd(in_XMM1,0xe1e6e6e9);
    uVar9 = auVar10._0_4_;
    uVar11 = auVar10._4_4_;
    uVar12 = auVar10._8_4_;
    uVar13 = auVar10._12_4_;
    auVar10._0_4_ = -(uint)(((uVar5 < uVar9) * uVar5 | (uVar5 >= uVar9) * uVar9) == uVar5);
    auVar10._4_4_ = -(uint)(((uVar6 < uVar11) * uVar6 | (uVar6 >= uVar11) * uVar11) == uVar6);
    auVar10._8_4_ = -(uint)(((uVar7 < uVar12) * uVar7 | (uVar7 >= uVar12) * uVar12) == uVar7);
    auVar10._12_4_ = -(uint)(((uVar8 < uVar13) * uVar8 | (uVar8 >= uVar13) * uVar13) == uVar8);
    iVar3 = movmskps((int)pss,auVar10);
    if ((((iVar3 != 0) || (4 < params.cParams.minMatch - 3)) ||
        (0x20000 < params.cParams.targetLength)) || (8 < params.cParams.strategy - ZSTD_fast)) {
      __assert_fail("!ZSTD_checkCParams(params->cParams)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5259,
                    "void ZSTD_CCtxParams_setZstdParams(ZSTD_CCtx_params *, const ZSTD_parameters *)"
                   );
    }
    (zcs->requestedParams).cParams.searchLog = (int)params.cParams._12_8_;
    (zcs->requestedParams).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
    (zcs->requestedParams).cParams.targetLength = (int)params.cParams._20_8_;
    (zcs->requestedParams).cParams.strategy = (int)((ulong)params.cParams._20_8_ >> 0x20);
    (zcs->requestedParams).cParams.windowLog = (int)params.cParams._0_8_;
    (zcs->requestedParams).cParams.chainLog = (int)((ulong)params.cParams._0_8_ >> 0x20);
    (zcs->requestedParams).cParams.hashLog = (int)params.cParams._8_8_;
    (zcs->requestedParams).cParams.searchLog = (int)((ulong)params.cParams._8_8_ >> 0x20);
    (zcs->requestedParams).fParams.contentSizeFlag = (int)params.fParams._0_8_;
    (zcs->requestedParams).fParams.checksumFlag = (int)((ulong)params.fParams._0_8_ >> 0x20);
    (zcs->requestedParams).fParams.noDictIDFlag = params.fParams.noDictIDFlag;
    (zcs->requestedParams).compressionLevel = 0;
    sVar2 = ZSTD_CCtx_loadDictionary_advanced(zcs,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
    sVar1 = 0;
    if (0xffffffffffffff88 < sVar2) {
      sVar1 = sVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pss)
{
    /* for compatibility with older programs relying on this behavior.
     * Users should now specify ZSTD_CONTENTSIZE_UNKNOWN.
     * This line will be removed in the future.
     */
    U64 const pledgedSrcSize = (pss==0 && params.fParams.contentSizeFlag==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) , "");
    ZSTD_CCtxParams_setZstdParams(&zcs->requestedParams, &params);
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    return 0;
}